

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Pgno finalDbSize(BtShared *pBt,Pgno nOrig,Pgno nFree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar4 = 0;
  if (1 < nOrig) {
    iVar4 = (nOrig - 2) - (nOrig - 2) % (pBt->usableSize / 5 + 1);
    iVar4 = iVar4 + (uint)(iVar4 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  uVar7 = pBt->usableSize / 5;
  uVar5 = nOrig - (((nFree - nOrig) + uVar7 + iVar4) / uVar7 + nFree);
  uVar1 = (uint)sqlite3PendingByte / pBt->pageSize;
  uVar3 = uVar1 + 1;
  uVar5 = uVar5 - (uVar5 < uVar3 && uVar3 < nOrig);
  do {
    uVar6 = uVar5;
    uVar2 = 0;
    if (1 < uVar6) {
      iVar4 = (uVar6 - 2) - (uVar6 - 2) % (uVar7 + 1);
      uVar2 = iVar4 + (uint)(iVar4 + 1U == uVar1) + 2;
    }
    uVar5 = uVar6 - 1;
  } while (uVar6 == uVar3 || uVar6 == uVar2);
  return uVar6;
}

Assistant:

static Pgno finalDbSize(BtShared *pBt, Pgno nOrig, Pgno nFree){
  int nEntry;                     /* Number of entries on one ptrmap page */
  Pgno nPtrmap;                   /* Number of PtrMap pages to be freed */
  Pgno nFin;                      /* Return value */

  nEntry = pBt->usableSize/5;
  nPtrmap = (nFree-nOrig+PTRMAP_PAGENO(pBt, nOrig)+nEntry)/nEntry;
  nFin = nOrig - nFree - nPtrmap;
  if( nOrig>PENDING_BYTE_PAGE(pBt) && nFin<PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }
  while( PTRMAP_ISPAGE(pBt, nFin) || nFin==PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }

  return nFin;
}